

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

fdb_status sb_read_latest(filemgr *file,sb_config sconfig,err_log_callback *log_callback)

{
  atomic<unsigned_long> *paVar1;
  byte bVar2;
  uint uVar3;
  crc_mode_e mode;
  _func_ssize_t_int_void_ptr_size_t_cs_off_t *p_Var4;
  _func_void_char_ptr_size_t *p_Var5;
  long lVar6;
  byte bVar7;
  docio_object *pdVar8;
  uint64_t uVar9;
  bid_t bVar10;
  _Invoker_type p_Var11;
  code *pcVar12;
  ulong *buf;
  filemgr *pfVar13;
  err_log_callback *peVar14;
  bool bVar15;
  int iVar16;
  uint32_t uVar17;
  void *pvVar18;
  ssize_t sVar19;
  void *pvVar20;
  void *pvVar21;
  superblock *psVar22;
  long lVar23;
  fdb_status fVar24;
  size_t buf_len;
  long lVar25;
  ulong uVar26;
  undefined7 in_register_00000031;
  ulong uVar27;
  size_t __n;
  ulong uVar28;
  superblock *psVar29;
  ulong auStack_310 [5];
  superblock local_2e8 [2];
  undefined1 local_e8 [8];
  FdbGcFunc gc;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  ulong local_90;
  ulong local_88;
  ulong *local_80;
  void *buf_aligned;
  ulong local_70;
  filemgr *local_68;
  ulong local_60;
  err_log_callback *local_58;
  void *local_50;
  undefined4 local_44;
  ulong local_40;
  ulong local_38;
  
  uVar27 = (ulong)sconfig.num_sb;
  local_58 = log_callback;
  if (file->sb == (superblock *)0x0) {
    local_90 = 0xffffffffffffffff;
  }
  else {
    local_90 = (file->sb->revnum).super___atomic_base<unsigned_long>._M_i - 1;
    auStack_310[4] = 0x139ee3;
    sb_free(file);
  }
  lVar6 = -(ulong)((uint)sconfig.num_sb * 40000);
  psVar29 = (superblock *)((long)local_2e8 + lVar6);
  *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x139f11;
  memset(psVar29,0,uVar27 * 200);
  local_44 = (undefined4)CONCAT71(in_register_00000031,sconfig.num_sb);
  local_40 = uVar27;
  if (sconfig.num_sb != '\0') {
    uVar26 = 0;
    uVar28 = 0;
    gc.func._M_invoker = (_Invoker_type)psVar29;
    local_88 = uVar27;
    local_68 = file;
    do {
      pfVar13 = local_68;
      p_Var11 = gc.func._M_invoker;
      local_60 = uVar28;
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x139f4b;
      pvVar18 = calloc(1,1);
      psVar29 = (superblock *)(p_Var11 + uVar26 * 200);
      local_38 = uVar26;
      *(void **)(p_Var11 + uVar26 * 200) = pvVar18;
      buf_aligned = psVar29;
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x139f6a;
      _sb_init(psVar29,(sb_config)(uint8_t)uVar27);
      uVar3 = pfVar13->blocksize;
      local_80 = (ulong *)0x0;
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x139f8a;
      iVar16 = posix_memalign(&local_80,0x200,(ulong)uVar3);
      if (iVar16 != 0) {
        local_80 = (ulong *)0x0;
      }
      buf = local_80;
      local_b8._8_8_ = 0;
      pcStack_a0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc:1392:18)>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc:1392:18)>
                 ::_M_manager;
      local_e8[0] = false;
      local_b8._M_unused._M_object = &local_80;
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x139fe8;
      std::function<void_()>::function((function<void_()> *)&gc,(function<void_()> *)&local_b8);
      pcVar12 = local_a8;
      if (local_a8 != (code *)0x0) {
        *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a005;
        (*pcVar12)(&local_b8,&local_b8,__destroy_functor);
      }
      __n = (size_t)(int)uVar3;
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a015;
      memset(buf,0,__n);
      iVar16 = local_68->fd;
      lVar23 = local_38 * __n;
      p_Var4 = local_68->ops->pread;
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a034;
      sVar19 = (*p_Var4)(iVar16,buf,__n,lVar23);
      peVar14 = local_58;
      if (uVar3 == (uint)sVar19) {
        bVar2 = *(byte *)((long)buf + (long)(int)(uVar3 - 1));
        if (bVar2 == 0xcc) {
          uVar28 = *buf;
          uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                   (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                   (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                   (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38;
          *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a063;
          bVar15 = ver_superblock_support(uVar28);
          peVar14 = local_58;
          pvVar18 = buf_aligned;
          if (bVar15) {
            uVar27 = buf[1];
            LOCK();
            local_70 = uVar28;
            *(ulong *)((long)buf_aligned + 8) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[2];
            LOCK();
            *(ulong *)((long)pvVar18 + 0x10) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[3];
            LOCK();
            *(ulong *)((long)pvVar18 + 0x90) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[4];
            LOCK();
            *(ulong *)((long)pvVar18 + 0x98) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[5];
            LOCK();
            *(ulong *)((long)pvVar18 + 0xb0) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            UNLOCK();
            uVar27 = buf[6];
            *(ulong *)((long)pvVar18 + 0xa0) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[7];
            *(ulong *)((long)pvVar18 + 0xa8) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[8];
            *(ulong *)((long)pvVar18 + 0x78) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[9];
            *(ulong *)((long)pvVar18 + 0x80) =
                 uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            uVar27 = buf[10];
            uVar28 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            LOCK();
            *(ulong *)((long)pvVar18 + 0x18) = uVar28;
            UNLOCK();
            uVar27 = buf[0xb];
            if (uVar27 == 0) {
              pvVar20 = (void *)0x0;
            }
            else {
              *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a115;
              pvVar20 = calloc(1,0x68);
              *(undefined8 *)((long)pvVar20 + 0x10) = 0;
              *(ulong *)((long)pvVar20 + 8) =
                   uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                   (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                   (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                   (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              *(undefined8 *)((long)pvVar20 + 0x48) = 0xffffffffffffffff;
              LOCK();
              *(undefined4 *)((long)pvVar20 + 0x60) = 1;
              UNLOCK();
            }
            LOCK();
            *(undefined8 *)((long)pvVar18 + 0x20) = 0;
            UNLOCK();
            uVar28 = uVar28 + 0x7fffff;
            uVar27 = uVar28 >> 0x17;
            *(ulong *)((long)pvVar18 + 0x70) = uVar27;
            buf_len = 0x60;
            if (0x7fffff < uVar28) {
              local_50 = pvVar20;
              *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a26c;
              pvVar20 = calloc(uVar27,8);
              *(void **)((long)pvVar18 + 0x60) = pvVar20;
              *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a280;
              pvVar21 = calloc(uVar27,0x38);
              *(void **)((long)pvVar18 + 0x68) = pvVar21;
              lVar23 = 0;
              do {
                lVar25 = lVar23;
                uVar28 = *(ulong *)((long)buf + lVar25 + 0x60);
                *(ulong *)((long)pvVar20 + lVar25) =
                     uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                     (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                     (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                     (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38;
                lVar23 = lVar25 + 8;
              } while (uVar27 * 8 != lVar25 + 8);
              buf_len = lVar25 + 0x68;
              pvVar20 = local_50;
            }
            uVar26 = local_70;
            if (pvVar20 != (void *)0x0) {
              uVar27 = *(long *)((long)pvVar20 + 8) + 0x7fffff;
              uVar28 = uVar27 >> 0x17;
              *(ulong *)((long)pvVar20 + 0x38) = uVar28;
              if (0x7fffff < uVar27) {
                local_50 = pvVar20;
                *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a2e0;
                pvVar20 = calloc(uVar28,8);
                *(void **)((long)local_50 + 0x28) = pvVar20;
                *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a2f8;
                pvVar21 = calloc(uVar28,0x38);
                *(void **)((long)local_50 + 0x30) = pvVar21;
                lVar23 = -buf_len;
                uVar27 = 0;
                do {
                  uVar26 = *(ulong *)((long)buf + uVar27 * 8 + buf_len);
                  *(ulong *)((long)pvVar20 + uVar27 * 8) =
                       uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                       (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                       (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                       (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
                  uVar27 = uVar27 + 1;
                  lVar23 = lVar23 + -8;
                } while (uVar28 != uVar27);
                buf_len = -lVar23;
                pvVar20 = local_50;
              }
              uVar26 = local_70;
              *(void **)((long)pvVar18 + 0x88) = pvVar20;
            }
            uVar27 = local_88;
            mode = local_68->crc_mode;
            *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a351;
            uVar17 = get_checksum((uint8_t *)buf,buf_len,mode);
            uVar28 = local_60;
            pvVar18 = buf_aligned;
            uVar3 = *(uint *)((long)buf + buf_len);
            bVar7 = 1;
            if (uVar17 != (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18)) {
              pvVar20 = *(void **)((long)buf_aligned + 0x60);
              *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a36f;
              free(pvVar20);
              pvVar20 = *(void **)((long)pvVar18 + 0x68);
              *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a378;
              free(pvVar20);
              *(undefined8 *)((long)pvVar18 + 0x60) = 0;
              *(undefined8 *)((long)pvVar18 + 0x68) = 0;
              peVar14 = local_58;
              bVar7 = 0;
              *(ulong *)((long)auStack_310 + lVar6 + 0x18) = local_38;
              *(ulong *)((long)auStack_310 + lVar6 + 0x10) = uVar26;
              *(char **)((long)auStack_310 + lVar6 + 8) =
                   "Failed to read the superblock: not supported version (magic: %lu, SB No.: %lu)";
              *(undefined8 *)((long)auStack_310 + lVar6) = 0x13a3bc;
              fdb_log_impl(peVar14,3,FDB_RESULT_SB_READ_FAIL,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                           ,"_sb_read_given_no",0x613,*(char **)((long)auStack_310 + lVar6 + 8));
            }
          }
          else {
            bVar7 = 0;
            *(ulong *)((long)auStack_310 + lVar6 + 0x18) = local_38;
            *(ulong *)((long)auStack_310 + lVar6 + 0x10) = uVar28;
            *(char **)((long)auStack_310 + lVar6 + 8) =
                 "Failed to read the superblock: not supported version (magic: %lu, SB No.: %lu)";
            *(undefined8 *)((long)auStack_310 + lVar6) = 0x13a226;
            fdb_log_impl(peVar14,3,FDB_RESULT_SB_READ_FAIL,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                         ,"_sb_read_given_no",0x59c,*(char **)((long)auStack_310 + lVar6 + 8));
            uVar28 = local_60;
          }
        }
        else {
          bVar7 = 0;
          *(ulong *)((long)auStack_310 + lVar6 + 0x18) = local_38;
          *(ulong *)((long)auStack_310 + lVar6 + 0x10) = (ulong)bVar2;
          *(char **)((long)auStack_310 + lVar6 + 8) =
               "Failed to read the superblock: incorrect block marker (marker: %x, SB No.: %lu). Note: this message might be a false alarm if upgrade is running."
          ;
          *(undefined8 *)((long)auStack_310 + lVar6) = 0x13a1dc;
          fdb_log_impl(peVar14,3,FDB_RESULT_SB_READ_FAIL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                       ,"_sb_read_given_no",0x58d,*(char **)((long)auStack_310 + lVar6 + 8));
          uVar28 = local_60;
        }
      }
      else {
        p_Var5 = local_68->ops->get_errno_str;
        *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a156;
        (*p_Var5)((char *)local_2e8,0x200);
        peVar14 = local_58;
        *(superblock **)((long)auStack_310 + lVar6 + 0x18) = local_2e8;
        *(ulong *)((long)auStack_310 + lVar6 + 0x10) = local_38;
        *(char **)((long)auStack_310 + lVar6 + 8) =
             "Failed to read the superblock: file read failure (SB No.: %lu), %s";
        *(undefined8 *)((long)auStack_310 + lVar6) = 0x13a190;
        fdb_log_impl(peVar14,3,FDB_RESULT_SB_READ_FAIL,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                     ,"_sb_read_given_no",0x582,*(char **)((long)auStack_310 + lVar6 + 8));
        bVar7 = 0;
        uVar28 = local_60;
      }
      *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a3cc;
      FdbGcFunc::~FdbGcFunc((FdbGcFunc *)local_e8);
      uVar26 = *(ulong *)((long)buf_aligned + 8);
      if ((bool)(uVar28 <= uVar26 & bVar7 & uVar26 < local_90)) {
        local_40 = local_38;
        uVar28 = uVar26;
      }
      uVar26 = local_38 + 1;
      file = local_68;
      psVar29 = (superblock *)gc.func._M_invoker;
    } while (uVar26 != uVar27);
  }
  uVar28 = local_40;
  if (local_40 == uVar27) {
    fVar24 = FDB_RESULT_SB_READ_FAIL;
    if ((char)local_44 != '\0') {
      do {
        *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a436;
        _sb_free(psVar29);
        psVar29 = psVar29 + 1;
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
  }
  else {
    *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a459;
    psVar22 = (superblock *)calloc(1,200);
    file->sb = psVar22;
    psVar22->config = psVar29[uVar28].config;
    LOCK();
    (psVar22->revnum).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].revnum.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    LOCK();
    (psVar22->bmp_revnum).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].bmp_revnum.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    LOCK();
    (psVar22->bmp_size).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].bmp_size.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    (psVar22->bmp)._M_b._M_p = psVar29[uVar28].bmp._M_b._M_p;
    LOCK();
    (psVar22->bmp_rcount).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].bmp_rcount.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    LOCK();
    (psVar22->bmp_wcount).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].bmp_wcount.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a4b5;
    pthread_spin_init(&psVar22->bmp_lock,1);
    psVar22->bmp_prev_size = psVar29[uVar28].bmp_prev_size;
    psVar22->bmp_prev = psVar29[uVar28].bmp_prev;
    pvVar18 = psVar29[uVar28].bmp_idx.aux;
    (psVar22->bmp_idx).root = psVar29[uVar28].bmp_idx.root;
    (psVar22->bmp_idx).aux = pvVar18;
    pdVar8 = (docio_object *)(&psVar29[uVar28].bmp_doc_offset)[1];
    psVar22->bmp_doc_offset = psVar29[uVar28].bmp_doc_offset;
    psVar22->bmp_docs = pdVar8;
    uVar9 = (&psVar29[uVar28].num_bmp_docs)[1];
    psVar22->num_bmp_docs = psVar29[uVar28].num_bmp_docs;
    psVar22->num_init_free_blocks = uVar9;
    psVar22->num_free_blocks = psVar29[uVar28].num_free_blocks;
    psVar22->rsv_bmp = psVar29[uVar28].rsv_bmp;
    LOCK();
    (psVar22->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].cur_alloc_bid.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    LOCK();
    (psVar22->last_hdr_bid).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].last_hdr_bid.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    bVar10 = (&psVar29[uVar28].min_live_hdr_revnum)[1];
    psVar22->min_live_hdr_revnum = psVar29[uVar28].min_live_hdr_revnum;
    psVar22->min_live_hdr_bid = bVar10;
    LOCK();
    (psVar22->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i =
         psVar29[uVar28].last_hdr_revnum.super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    psVar22->num_alloc = psVar29[uVar28].num_alloc;
    *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a563;
    pthread_spin_init(&psVar22->lock,1);
    if ((file->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i != 0xffffffffffffffff) {
      LOCK();
      (file->last_commit).super___atomic_base<unsigned_long>._M_i =
           (long)file->config->blocksize *
           (file->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
    }
    LOCK();
    paVar1 = &file->sb->revnum;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    psVar22 = file->sb;
    fVar24 = FDB_RESULT_SUCCESS;
    *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a5b7;
    avl_init(&psVar22->bmp_idx,(void *)0x0);
    uVar28 = local_40;
    if ((char)local_44 != '\0') {
      uVar26 = 0;
      do {
        if (uVar28 != uVar26) {
          *(undefined8 *)((long)local_2e8 + lVar6 + -8) = 0x13a5d0;
          _sb_free(psVar29);
        }
        uVar26 = uVar26 + 1;
        psVar29 = psVar29 + 1;
      } while (uVar27 != uVar26);
      fVar24 = FDB_RESULT_SUCCESS;
    }
  }
  return fVar24;
}

Assistant:

fdb_status sb_read_latest(struct filemgr *file,
                          struct sb_config sconfig,
                          err_log_callback *log_callback)
{
    size_t i, max_sb_no = sconfig.num_sb;
    uint64_t max_revnum = 0;
    uint64_t revnum_limit = (uint64_t)0xffffffffffffffff;
    fdb_status fs;
    struct superblock *sb_arr;

    if (file->sb) {
        // Superblock is already read previously.
        // This means that there are some problems with the current superblock
        // so that we have to read another candidate.

        // Note: 'sb->revnum' denotes the revnum of next superblock to be
        // written, so we need to subtract 1 from it to get the revnum of
        // the current superblock successfully read from the file.
        revnum_limit = atomic_get_uint64_t(&file->sb->revnum) - 1;
        sb_free(file);
    }

    sb_arr = alca(struct superblock,
                  sconfig.num_sb * sizeof(struct superblock));
    memset(sb_arr, 0x0, sconfig.num_sb * sizeof(struct superblock));

    // read all superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        sb_arr[i].config = (struct sb_config*)calloc(1, sizeof(struct sb_config));
        _sb_init(&sb_arr[i], sconfig);
        fs = _sb_read_given_no(file, i, &sb_arr[i], log_callback);

        uint64_t cur_revnum = atomic_get_uint64_t(&sb_arr[i].revnum);
        if (fs == FDB_RESULT_SUCCESS &&
            cur_revnum >= max_revnum &&
            cur_revnum < revnum_limit) {
            max_sb_no = i;
            max_revnum = cur_revnum;
        }
    }

    if (max_sb_no == sconfig.num_sb) {
        // all superblocks are broken
        fs = FDB_RESULT_SB_READ_FAIL;
        for (i=0; i<sconfig.num_sb; ++i) {
            _sb_free(&sb_arr[i]);
        }
        // no readable superblock
        // (if not corrupted, it may be a normal old version file)
        return fs;
    }

    file->sb = (struct superblock*)calloc(1, sizeof(struct superblock));
    _sb_copy(file->sb, &sb_arr[max_sb_no]);

    // set last commit position
    if (atomic_get_uint64_t(&file->sb->cur_alloc_bid) != BLK_NOT_FOUND) {
        atomic_store_uint64_t(&file->last_commit,
                              atomic_get_uint64_t(&file->sb->cur_alloc_bid) *
                              file->config->blocksize);
    } else {
        // otherwise, last_commit == file->pos
        // (already set by filemgr_open() function)
    }

    atomic_incr_uint64_t(&file->sb->revnum);
    avl_init(&file->sb->bmp_idx, NULL);

    // free the other superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        if (i != max_sb_no) {
            _sb_free(&sb_arr[i]);
        }
    }

    return FDB_RESULT_SUCCESS;
}